

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O3

vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *
dgrminer::find_forward_edge_candidates
          (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
           *__return_storage_ptr__,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *adj_list,
          vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
          *adj_more_info,int src,vector<int,_std::allocator<int>_> *sequence_of_nodes,
          vector<int,_std::allocator<int>_> *real_second_edge_ids)

{
  pointer pvVar1;
  pointer piVar2;
  iterator __position;
  iterator __position_00;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer piVar6;
  long lVar7;
  array<int,_8UL> *__args;
  long lVar8;
  ulong uVar9;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (adj_list->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  piVar6 = pvVar1[src].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (*(pointer *)
       ((long)&pvVar1[src].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar6) {
    uVar9 = 0;
    do {
      piVar2 = (sequence_of_nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)(sequence_of_nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar2;
      if (lVar7 != 0) {
        lVar7 = lVar7 >> 2;
        lVar8 = 0;
        do {
          if (piVar6[uVar9] == piVar2[lVar8]) goto LAB_00145bd5;
          lVar8 = lVar8 + 1;
        } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
      }
      __position._M_current =
           (real_second_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (real_second_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)real_second_edge_ids,__position,piVar6 + uVar9
                  );
      }
      else {
        *__position._M_current = piVar6[uVar9];
        (real_second_edge_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __args = (array<int,_8UL> *)
               (uVar9 * 0x20 +
               *(long *)&(adj_more_info->
                         super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[src].
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         ._M_impl.super__Vector_impl_data);
      __position_00._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
        _M_realloc_insert<std::array<int,8ul>const&>
                  ((vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)
                   __return_storage_ptr__,__position_00,__args);
      }
      else {
        uVar3 = *(undefined8 *)__args->_M_elems;
        uVar4 = *(undefined8 *)(__args->_M_elems + 2);
        uVar5 = *(undefined8 *)(__args->_M_elems + 6);
        *(undefined8 *)((__position_00._M_current)->_M_elems + 4) =
             *(undefined8 *)(__args->_M_elems + 4);
        *(undefined8 *)((__position_00._M_current)->_M_elems + 6) = uVar5;
        *(undefined8 *)(__position_00._M_current)->_M_elems = uVar3;
        *(undefined8 *)((__position_00._M_current)->_M_elems + 2) = uVar4;
        (__return_storage_ptr__->
        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
LAB_00145bd5:
      uVar9 = uVar9 + 1;
      pvVar1 = (adj_list->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar6 = pvVar1[src].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)*(pointer *)
                                    ((long)&pvVar1[src].
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data + 8) - (long)piVar6 >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::array<int, 8>> find_forward_edge_candidates(std::vector<std::vector<int>> &adj_list,
		std::vector<std::vector<std::array<int, 8>>> &adj_more_info,
		int src, std::vector<int> &sequence_of_nodes, std::vector<int> &real_second_edge_ids)
	{
		std::vector<std::array<int, 8>> edge_candidates;

		for (size_t v = 0; v < adj_list[src].size(); v++)
		{
			bool is_in_sequence_of_nodes = false;
			for (size_t i = 0; i < sequence_of_nodes.size(); i++)
			{
				if (adj_list[src][v] == sequence_of_nodes[i]) {
					is_in_sequence_of_nodes = true;
					break;
				}
			}
			if (!is_in_sequence_of_nodes) {
			  	real_second_edge_ids.push_back(adj_list[src][v]);
				edge_candidates.push_back(adj_more_info[src][v]);
			}
		}
		return edge_candidates;
	}